

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::CodeHolder::relocateToBase(CodeHolder *this,uint64_t baseAddress)

{
  int iVar1;
  uint uVar2;
  OffsetFormat OVar3;
  long lVar4;
  OffsetFormat OVar5;
  undefined1 uVar6;
  bool bVar7;
  Error EVar8;
  ExpressionValueType *pEVar9;
  Value VVar10;
  ulong uVar11;
  ulong uVar12;
  ExpressionValueType *pEVar13;
  Section *pSVar14;
  bool bVar15;
  ulong unaff_RBP;
  Value self;
  CodeHolder *pCVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  CodeHolder *unaff_R12;
  OffsetFormat *unaff_R13;
  Value *pVVar20;
  long *plVar21;
  Value aVStack_c0 [2];
  Value VStack_b0;
  Value VStack_a8;
  Value VStack_a0;
  Section *pSStack_98;
  CodeHolder *pCStack_90;
  OffsetFormat *pOStack_88;
  CodeHolder *pCStack_80;
  long *plStack_78;
  code *pcStack_70;
  Arch local_61;
  ulong local_60;
  Section *local_58;
  uint64_t local_50;
  uint8_t *local_48;
  Value local_40;
  ulong local_38;
  
  if (baseAddress == 0xffffffffffffffff) {
LAB_0011924f:
    unaff_RBP = 2;
    goto LAB_00119229;
  }
  this->_baseAddress = baseAddress;
  local_61 = (this->_environment)._arch;
  pSVar14 = this->_addressTableSection;
  VVar10.constant = baseAddress;
  pCVar16 = this;
  if (pSVar14 == (Section *)0x0) {
    local_48 = (uint8_t *)0x0;
  }
  else {
    unaff_R12 = (CodeHolder *)&pSVar14->_buffer;
    if ((pSVar14->_buffer)._capacity < pSVar14->_virtualSize) {
      unaff_RBP = 9;
      if (((pSVar14->_buffer)._flags & kIsFixed) != kNone) goto LAB_00119229;
      pcStack_70 = (code *)0x118f4e;
      VVar10 = (Value)unaff_R12;
      EVar8 = CodeHolder_reserveInternal(this,(CodeBuffer *)unaff_R12,pSVar14->_virtualSize);
      unaff_RBP = (ulong)EVar8;
      if (EVar8 != 0) goto LAB_00119229;
    }
    local_48 = ((CodeBuffer *)unaff_R12)->_data;
  }
  local_60 = 0;
  local_58 = pSVar14;
  local_50 = baseAddress;
  if ((ulong)*(uint *)&this->field_0x110 != 0) {
    pSVar14 = (Section *)(*(long **)&this->_relocations + *(uint *)&this->field_0x110);
    local_38 = (ulong)(local_61 & k32BitMask) ^ 3;
    local_60 = 0;
    unaff_RBP = 0x17;
    plVar21 = *(long **)&this->_relocations;
    do {
      unaff_R13 = (OffsetFormat *)*plVar21;
      iVar1 = *(int *)&unaff_R13->_valueOffset;
      if (iVar1 != 0) {
        uVar17._0_1_ = unaff_R13[2]._type;
        uVar17._1_1_ = unaff_R13[2]._flags;
        uVar17._2_1_ = unaff_R13[2]._regionSize;
        uVar17._3_1_ = unaff_R13[2]._valueSize;
        if (*(uint *)&this->field_0xe0 <= uVar17) {
          pcStack_70 = (code *)0x11924a;
          relocateToBase();
LAB_0011924a:
          pcStack_70 = (code *)0x11924f;
          relocateToBase();
          goto LAB_0011924f;
        }
        lVar19 = *(long *)(*(long *)&this->_sections + (ulong)uVar17 * 8);
        uVar2._0_1_ = unaff_R13[2]._valueOffset;
        uVar2._1_1_ = unaff_R13[2]._immBitCount;
        uVar2._2_1_ = unaff_R13[2]._immBitShift;
        uVar2._3_1_ = unaff_R13[2]._immDiscardLsb;
        if ((ulong)uVar2 == 0xffffffff) {
          lVar18 = 0;
        }
        else {
          if (*(uint *)&this->field_0xe0 <= uVar2) goto LAB_0011924a;
          lVar18 = *(long *)(*(long *)&this->_sections + (ulong)uVar2 * 8);
        }
        self = (Value)((Value *)(unaff_R13 + 4))->expression;
        OVar3 = unaff_R13[3];
        if ((((ulong)*(OffsetFormat *)(lVar19 + 0x50) <= (ulong)OVar3) ||
            (pCVar16 = (CodeHolder *)(ulong)unaff_R13[1]._regionSize,
            (CodeHolder *)((long)*(OffsetFormat *)(lVar19 + 0x50) - (long)OVar3) < pCVar16)) ||
           (4 < iVar1 - 1U)) goto LAB_00119229;
        lVar4 = *(long *)(lVar19 + 0x10);
        unaff_R12 = *(CodeHolder **)(lVar19 + 0x48);
        VVar10 = self;
        local_40 = self;
        switch(iVar1) {
        case 1:
          pcStack_70 = (code *)0x119072;
          EVar8 = CodeHolder_evaluateExpression
                            ((CodeHolder *)self.expression,(Expression *)&local_40,
                             (uint64_t *)&switchD_00119063::switchdataD_0014c3c0);
          VVar10 = local_40;
          if (EVar8 != 0) {
            unaff_RBP = (ulong)EVar8;
            goto LAB_00119229;
          }
          break;
        case 3:
          if (lVar18 == 0) goto LAB_00119229;
          VVar10.expression =
               (Expression *)
               ((self.expression)->valueType + *(long *)(lVar18 + 0x10) + local_50 + -1);
          break;
        case 4:
          VVar10.expression =
               (Expression *)
               ((long)self.expression -
               (long)(&(pCVar16->_environment)._arch + lVar4 + local_50 + (long)OVar3));
          if ((local_61 & k32BitMask) == kUnknown) {
            if ((long)(int)VVar10.constant != VVar10.constant) {
LAB_0011923e:
              unaff_RBP = 0x18;
              goto LAB_00119229;
            }
          }
          else {
            VVar10 = (Value)(long)(int)VVar10.constant;
          }
          break;
        case 5:
          if ((unaff_R13[1]._valueSize != '\x04') ||
             (uVar12 = (ulong)unaff_R13[1]._valueOffset + (long)OVar3, uVar12 < 2))
          goto LAB_00119229;
          VVar10.expression =
               (Expression *)
               ((long)self.expression -
               (long)(&(pCVar16->_environment)._arch + local_50 + lVar4 + (long)OVar3));
          if ((long)(int)VVar10.constant != VVar10.constant) {
            uVar11 = *(ulong *)&this->_addressTableEntries;
            while( true ) {
              if (uVar11 == 0) goto LAB_00119229;
              OVar5 = *(OffsetFormat *)(uVar11 + 0x10);
              uVar17 = (uint)((ulong)OVar5 >= self.constant && OVar5 != (OffsetFormat)self.constant)
                       - (uint)((ulong)OVar5 < self.constant);
              if (uVar17 == 0) break;
              uVar11 = *(ulong *)(uVar11 + (ulong)(uVar17 >> 0x1f) * 8) & 0xfffffffffffffffe;
            }
            if (local_58 == (Section *)0x0) goto LAB_00119260;
            uVar17 = *(uint *)(uVar11 + 0x18);
            if (uVar17 == 0xffffffff) {
              uVar17 = (uint)local_60;
              *(uint *)(uVar11 + 0x18) = uVar17;
              local_60 = (ulong)(uVar17 + 1);
            }
            lVar19 = (ulong)uVar17 << ((byte)local_38 & 0x3f);
            VVar10.expression =
                 (Expression *)
                 (local_58->_offset +
                 (lVar19 - (long)(&(pCVar16->_environment)._arch + (long)OVar3 + lVar4)));
            if ((long)(int)VVar10.constant != VVar10.constant) goto LAB_0011923e;
            uVar6 = 0x15;
            if ((&unaff_R12[-1].field_0x157)[uVar12] != -0x18) {
              if ((&unaff_R12[-1].field_0x157)[uVar12] != -0x17) goto LAB_00119229;
              uVar6 = 0x25;
            }
            (&unaff_R12[-1].field_0x156)[uVar12] = 0xff;
            (&unaff_R12[-1].field_0x157)[uVar12] = uVar6;
            *(OffsetFormat *)(local_48 + lVar19) = unaff_R13[4];
          }
        }
        unaff_R12 = (CodeHolder *)(&(unaff_R12->_environment)._arch + (long)unaff_R13[3]);
        unaff_R13 = unaff_R13 + 1;
        pcStack_70 = (code *)0x1191d9;
        pCVar16 = unaff_R12;
        bVar7 = CodeWriterUtils::writeOffset(unaff_R12,VVar10.constant,unaff_R13);
        if (!bVar7) goto LAB_00119229;
      }
      baseAddress = (uint64_t)(plVar21 + 1);
      plVar21 = (long *)baseAddress;
    } while ((Section *)baseAddress != pSVar14);
  }
  if (*(int *)&this->field_0xf0 == 0) {
    pcStack_70 = (code *)0x11925b;
    relocateToBase();
    self = VVar10;
  }
  else {
    unaff_RBP = 0;
    if (*(Section **)(*(long *)&this->_sectionsByOrder + (ulong)(*(int *)&this->field_0xf0 - 1) * 8)
        != local_58) {
LAB_00119229:
      return (Error)unaff_RBP;
    }
    self = VVar10;
    if (local_58 != (Section *)0x0) {
      uVar12 = (ulong)(uint)((int)local_60 << (local_61 & k32BitMask ^ kRISCV32));
      (local_58->_buffer)._size = uVar12;
      local_58->_virtualSize = uVar12;
      goto LAB_00119229;
    }
  }
  pcStack_70 = (code *)0x119260;
  relocateToBase();
  plVar21 = (long *)baseAddress;
LAB_00119260:
  pcStack_70 = CodeHolder_evaluateExpression;
  relocateToBase();
  lVar19 = 0;
  pVVar20 = aVStack_c0;
  bVar7 = true;
  VStack_b0 = self;
  pSStack_98 = pSVar14;
  pCStack_90 = unaff_R12;
  pOStack_88 = unaff_R13;
  pCStack_80 = this;
  plStack_78 = plVar21;
  pcStack_70 = (code *)unaff_RBP;
  do {
    bVar15 = bVar7;
    VVar10.constant._1_7_ = 0;
    VVar10.constant._0_1_ = (&(pCVar16->_environment)._subArch)[lVar19];
    if (3 < VVar10.constant) {
      return 3;
    }
    switch(VVar10.constant) {
    case 1:
      VVar10 = *(Value *)(&pCVar16->_cpuFeatures + lVar19 * 8);
      break;
    case 2:
      lVar18 = *(long *)(*(long *)(&pCVar16->_cpuFeatures + lVar19 * 8) + 0x20);
      if (lVar18 == 0) {
        return 0x43;
      }
      VVar10.expression =
           (Expression *)
           (*(long *)(*(long *)(&pCVar16->_cpuFeatures + lVar19 * 8) + 0x18) +
           *(long *)(lVar18 + 0x10));
      break;
    case 3:
      EVar8 = CodeHolder_evaluateExpression
                        (*(CodeHolder **)(&pCVar16->_cpuFeatures + lVar19 * 8),
                         (Expression *)&VStack_a0,
                         (uint64_t *)
                         ((long)&switchD_001192a7::switchdataD_0014c3d4 +
                         (long)(int)(&switchD_001192a7::switchdataD_0014c3d4)[VVar10.constant]));
      VVar10 = VStack_a0;
      if (EVar8 != 0) {
        return EVar8;
      }
    }
    pVVar20->constant = (uint64_t)VVar10;
    lVar19 = 1;
    pVVar20 = &VStack_a8;
    bVar7 = false;
  } while (bVar15);
  switch((pCVar16->_environment)._arch) {
  case kUnknown:
    pEVar9 = (VStack_a8.expression)->valueType + (aVStack_c0[0].constant - 1);
    break;
  case k32BitMask:
    pEVar9 = (ExpressionValueType *)((long)aVStack_c0[0].expression - (long)VStack_a8);
    break;
  case kHost:
    pEVar9 = (ExpressionValueType *)(VStack_a8.constant * aVStack_c0[0].constant);
    break;
  case kRISCV32:
    pEVar13 = (ExpressionValueType *)(aVStack_c0[0].constant << ((byte)VStack_a8.constant & 0x3f));
    goto LAB_00119352;
  case kRISCV64:
    pEVar13 = (ExpressionValueType *)(aVStack_c0[0].constant >> ((byte)VStack_a8.constant & 0x3f));
LAB_00119352:
    pEVar9 = (ExpressionValueType *)0x0;
    if (VStack_a8.constant < 0x40) {
      pEVar9 = pEVar13;
    }
    break;
  case kARM:
    VVar10.constant = 0x3f;
    if (VStack_a8.constant < 0x3f) {
      VVar10 = VStack_a8;
    }
    pEVar9 = (ExpressionValueType *)((long)aVStack_c0[0].constant >> ((byte)VVar10.constant & 0x3f))
    ;
    break;
  default:
    return 3;
  }
  *(ExpressionValueType **)VStack_b0.expression = pEVar9;
  return 0;
}

Assistant:

Error CodeHolder::relocateToBase(uint64_t baseAddress) noexcept {
  // Base address must be provided.
  if (ASMJIT_UNLIKELY(baseAddress == Globals::kNoBaseAddress))
    return DebugUtils::errored(kErrorInvalidArgument);

  _baseAddress = baseAddress;
  uint32_t addressSize = _environment.registerSize();

  Section* addressTableSection = _addressTableSection;
  uint32_t addressTableEntryCount = 0;
  uint8_t* addressTableEntryData = nullptr;

  if (addressTableSection) {
    ASMJIT_PROPAGATE(
      reserveBuffer(&addressTableSection->_buffer, size_t(addressTableSection->virtualSize())));
    addressTableEntryData = addressTableSection->_buffer.data();
  }

  // Relocate all recorded locations.
  for (const RelocEntry* re : _relocations) {
    // Possibly deleted or optimized-out entry.
    if (re->relocType() == RelocType::kNone)
      continue;

    Section* sourceSection = sectionById(re->sourceSectionId());
    Section* targetSection = nullptr;

    if (re->targetSectionId() != Globals::kInvalidId)
      targetSection = sectionById(re->targetSectionId());

    uint64_t value = re->payload();
    uint64_t sectionOffset = sourceSection->offset();
    uint64_t sourceOffset = re->sourceOffset();

    // Make sure that the `RelocEntry` doesn't go out of bounds.
    size_t regionSize = re->format().regionSize();
    if (ASMJIT_UNLIKELY(re->sourceOffset() >= sourceSection->bufferSize() ||
                        sourceSection->bufferSize() - size_t(re->sourceOffset()) < regionSize))
      return DebugUtils::errored(kErrorInvalidRelocEntry);

    uint8_t* buffer = sourceSection->data();

    switch (re->relocType()) {
      case RelocType::kExpression: {
        Expression* expression = (Expression*)(uintptr_t(value));
        ASMJIT_PROPAGATE(CodeHolder_evaluateExpression(this, expression, &value));
        break;
      }

      case RelocType::kAbsToAbs: {
        break;
      }

      case RelocType::kRelToAbs: {
        // Value is currently a relative offset from the start of its section.
        // We have to convert it to an absolute offset (including base address).
        if (ASMJIT_UNLIKELY(!targetSection))
          return DebugUtils::errored(kErrorInvalidRelocEntry);

        //value += baseAddress + sectionOffset + sourceOffset + regionSize;
        value += baseAddress + targetSection->offset();
        break;
      }

      case RelocType::kAbsToRel: {
        value -= baseAddress + sectionOffset + sourceOffset + regionSize;

        // Sign extend as we are not interested in the high 32-bit word in a 32-bit address space.
        if (addressSize <= 4)
          value = uint64_t(int64_t(int32_t(value & 0xFFFFFFFFu)));
        else if (!Support::isInt32(int64_t(value)))
          return DebugUtils::errored(kErrorRelocOffsetOutOfRange);

        break;
      }

      case RelocType::kX64AddressEntry: {
        size_t valueOffset = size_t(re->sourceOffset()) + re->format().valueOffset();
        if (re->format().valueSize() != 4 || valueOffset < 2)
          return DebugUtils::errored(kErrorInvalidRelocEntry);

        // First try whether a relative 32-bit displacement would work.
        value -= baseAddress + sectionOffset + sourceOffset + regionSize;
        if (!Support::isInt32(int64_t(value))) {
          // Relative 32-bit displacement is not possible, use '.addrtab' section.
          AddressTableEntry* atEntry = _addressTableEntries.get(re->payload());
          if (ASMJIT_UNLIKELY(!atEntry))
            return DebugUtils::errored(kErrorInvalidRelocEntry);

          // Cannot be null as we have just matched the `AddressTableEntry`.
          ASMJIT_ASSERT(addressTableSection != nullptr);

          if (!atEntry->hasAssignedSlot())
            atEntry->_slot = addressTableEntryCount++;

          size_t atEntryIndex = size_t(atEntry->slot()) * addressSize;
          uint64_t addrSrc = sectionOffset + sourceOffset + regionSize;
          uint64_t addrDst = addressTableSection->offset() + uint64_t(atEntryIndex);

          value = addrDst - addrSrc;
          if (!Support::isInt32(int64_t(value)))
            return DebugUtils::errored(kErrorRelocOffsetOutOfRange);

          // Bytes that replace [REX, OPCODE] bytes.
          uint32_t byte0 = 0xFF;
          uint32_t byte1 = buffer[valueOffset - 1];

          if (byte1 == 0xE8) {
            // Patch CALL/MOD byte to FF /2 (-> 0x15).
            byte1 = x86EncodeMod(0, 2, 5);
          }
          else if (byte1 == 0xE9) {
            // Patch JMP/MOD byte to FF /4 (-> 0x25).
            byte1 = x86EncodeMod(0, 4, 5);
          }
          else {
            return DebugUtils::errored(kErrorInvalidRelocEntry);
          }

          // Patch `jmp/call` instruction.
          buffer[valueOffset - 2] = uint8_t(byte0);
          buffer[valueOffset - 1] = uint8_t(byte1);

          Support::writeU64uLE(addressTableEntryData + atEntryIndex, re->payload());
        }
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidRelocEntry);
    }

    if (!CodeWriterUtils::writeOffset(buffer + re->sourceOffset(), int64_t(value), re->format())) {
      return DebugUtils::errored(kErrorInvalidRelocEntry);
    }
  }

  // Fixup the virtual size of the address table if it's the last section.
  if (_sectionsByOrder.last() == addressTableSection) {
    ASMJIT_ASSERT(addressTableSection != nullptr);

    size_t addressTableSize = addressTableEntryCount * addressSize;
    addressTableSection->_buffer._size = addressTableSize;
    addressTableSection->_virtualSize = addressTableSize;
  }

  return kErrorOk;
}